

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_instance.c
# Opt level: O3

_Bool al_set_sample_instance_position(ALLEGRO_SAMPLE_INSTANCE *spl,uint val)

{
  ALLEGRO_VOICE *voice;
  _Bool _Var1;
  
  voice = (spl->parent).u.voice;
  if ((voice == (ALLEGRO_VOICE *)0x0) || ((spl->parent).is_voice != true)) {
    if (spl->mutex == (ALLEGRO_MUTEX *)0x0) {
      spl->pos = val;
    }
    else {
      al_lock_mutex();
      spl->pos = val;
      if (spl->mutex != (ALLEGRO_MUTEX *)0x0) {
        al_unlock_mutex();
      }
    }
  }
  else {
    _Var1 = al_set_voice_position(voice,val);
    if (!_Var1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool al_set_sample_instance_position(ALLEGRO_SAMPLE_INSTANCE *spl,
   unsigned int val)
{
   ASSERT(spl);

   if (spl->parent.u.ptr && spl->parent.is_voice) {
      ALLEGRO_VOICE *voice = spl->parent.u.voice;
      if (!al_set_voice_position(voice, val))
         return false;
   }
   else {
      maybe_lock_mutex(spl->mutex);
      spl->pos = val;
      maybe_unlock_mutex(spl->mutex);
   }

   return true;
}